

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O2

int memieq(void *a,void *b,size_t n)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  
  sVar2 = 0;
  do {
    if (n == sVar2) {
      return 1;
    }
    bVar1 = *(byte *)((long)a + sVar2);
    bVar3 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar3 = bVar1;
    }
    bVar1 = *(byte *)((long)b + sVar2);
    bVar4 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar4 = bVar1;
    }
    sVar2 = sVar2 + 1;
  } while (bVar3 == bVar4);
  return 0;
}

Assistant:

static int memieq(const void *a, const void *b, size_t n) {
  size_t i;
  const uint8_t *aa = a, *bb = b;

  for (i = 0; i < n; ++i) {
    if (downcase(aa[i]) != downcase(bb[i])) {
      return 0;
    }
  }
  return 1;
}